

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O3

Result __thiscall tonk::UDPSocket::ignoreUnreachable(UDPSocket *this,bool enabled)

{
  Result *success;
  
  success = (Result *)this;
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)0x0;
  return (Result)success;
}

Assistant:

Result UDPSocket::ignoreUnreachable(bool enabled)
{
#ifdef _WIN32
    u_long behavior = enabled ? FALSE : TRUE;

    // FALSE = Disable behavior where, after receiving an ICMP Unreachable message,
    // WSARecvFrom() will fail.  Disables ICMP completely; normally this is good.
    // But when you're writing a client endpoint, you probably want to listen to
    // ICMP Port Unreachable or other failures until you get the first packet.
    // After that call IgnoreUnreachable() to avoid spoofed ICMP exploits.

    const int iResult = ::ioctlsocket(
        Socket->native_handle(),
        SIO_UDP_CONNRESET,
        &behavior);

    if (0 != iResult) {
        return Result("UDPSocket::ignoreUnreachable", "ioctlsocket failed", ErrorType::LastErr, ::WSAGetLastError());
    }
#else
    TONK_UNUSED(enabled);
#endif

    return Result::Success();
}